

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

void r4k_helper_tlbwi_mips64(CPUMIPSState_conflict5 *env)

{
  ulong *puVar1;
  ushort uVar2;
  uint first;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  int idx;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  
  uVar9 = (uint)env->CP0_EntryHi;
  uVar10 = (ushort)env->CP0_EntryHi_ASID_mask & uVar9;
  first = env->tlb->nb_tlb;
  uVar5 = (ulong)(env->CP0_Index & 0x7fffffff) % (ulong)first;
  uVar3 = env->CP0_EntryLo0;
  uVar4 = env->CP0_EntryLo1;
  uVar6 = (uint)uVar4;
  uVar7 = (uint)uVar3;
  bVar12 = (env->CP0_Config5 & 0x20000) != 0;
  if (bVar12) {
    uVar10 = env->CP0_MemoryMapID;
  }
  puVar1 = (ulong *)((long)&env->tlb->mmu + uVar5 * 0x28);
  if (bVar12) {
    uVar11 = (uint)puVar1[2];
  }
  else {
    uVar11 = (uint)*(ushort *)((long)puVar1 + 0xc);
  }
  if ((*puVar1 == (env->SEGMask & env->CP0_EntryHi & 0xffffffffffffe000)) && (uVar11 == uVar10)) {
    uVar2 = *(ushort *)((long)puVar1 + 0x14);
    if ((((uVar6 & uVar7 & 1) == (uVar2 & 1)) &&
        (((((short)uVar2 < 0 || (uVar9 >> 10 & 1) == 0 &&
           ((byte)(-1 < (char)uVar2 | (byte)((uVar7 & 2) >> 1)) == 1)) &&
          ((byte)((uVar2 >> 9 & 1) == 0 | (byte)((uVar7 & 4) >> 2)) == 1)) &&
         ((bVar8 = (byte)(uVar2 >> 8), (bVar8 >> 3 & 1 | (uVar3 & 0x4000000000000000) == 0) == 1 &&
          ((bVar8 >> 5 & 1 | -1 < (long)uVar3) == 1)))))) &&
       (((byte)((uVar2 >> 8 & 1) == 0 | (byte)((uVar6 & 2) >> 1)) == 1 &&
        ((((byte)((uVar2 >> 10 & 1) == 0 | (byte)((uVar6 & 4) >> 2)) == 1 &&
          ((bVar8 >> 4 & 1 | (uVar4 & 0x4000000000000000) == 0) == 1)) &&
         ((bVar8 >> 6 & 1) != 0 || -1 < (long)uVar4)))))) goto LAB_007dd708;
  }
  r4k_mips_tlb_flush_extra(env,first);
LAB_007dd708:
  idx = (int)uVar5;
  r4k_invalidate_tlb_mips64(env,idx,0);
  r4k_fill_tlb(env,idx);
  return;
}

Assistant:

void r4k_helper_tlbwi(CPUMIPSState *env)
{
    bool mi = !!((env->CP0_Config5 >> CP0C5_MI) & 1);
    target_ulong VPN;
    uint16_t ASID = env->CP0_EntryHi & env->CP0_EntryHi_ASID_mask;
    uint32_t MMID = env->CP0_MemoryMapID;
    uint32_t tlb_mmid;
    bool EHINV, G, V0, D0, V1, D1, XI0, XI1, RI0, RI1;
    r4k_tlb_t *tlb;
    int idx;

    MMID = mi ? MMID : (uint32_t) ASID;

    idx = (env->CP0_Index & ~0x80000000) % env->tlb->nb_tlb;
    tlb = &env->tlb->mmu.r4k.tlb[idx];
    VPN = env->CP0_EntryHi & (TARGET_PAGE_MASK << 1);
#if defined(TARGET_MIPS64)
    VPN &= env->SEGMask;
#endif
    EHINV = (env->CP0_EntryHi & (1 << CP0EnHi_EHINV)) != 0;
    G = env->CP0_EntryLo0 & env->CP0_EntryLo1 & 1;
    V0 = (env->CP0_EntryLo0 & 2) != 0;
    D0 = (env->CP0_EntryLo0 & 4) != 0;
    XI0 = (env->CP0_EntryLo0 >> CP0EnLo_XI) &1;
    RI0 = (env->CP0_EntryLo0 >> CP0EnLo_RI) &1;
    V1 = (env->CP0_EntryLo1 & 2) != 0;
    D1 = (env->CP0_EntryLo1 & 4) != 0;
    XI1 = (env->CP0_EntryLo1 >> CP0EnLo_XI) &1;
    RI1 = (env->CP0_EntryLo1 >> CP0EnLo_RI) &1;

    tlb_mmid = mi ? tlb->MMID : (uint32_t) tlb->ASID;
    /*
     * Discard cached TLB entries, unless tlbwi is just upgrading access
     * permissions on the current entry.
     */
    if (tlb->VPN != VPN || tlb_mmid != MMID || tlb->G != G ||
        (!tlb->EHINV && EHINV) ||
        (tlb->V0 && !V0) || (tlb->D0 && !D0) ||
        (!tlb->XI0 && XI0) || (!tlb->RI0 && RI0) ||
        (tlb->V1 && !V1) || (tlb->D1 && !D1) ||
        (!tlb->XI1 && XI1) || (!tlb->RI1 && RI1)) {
        r4k_mips_tlb_flush_extra(env, env->tlb->nb_tlb);
    }

    r4k_invalidate_tlb(env, idx, 0);
    r4k_fill_tlb(env, idx);
}